

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void __thiscall
CircularTest_Test3_B_Test::CircularTest_Test3_B_Test(CircularTest_Test3_B_Test *this)

{
  CircularTest_Test3_B_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CircularTest_Test3_B_Test_0023e748;
  return;
}

Assistant:

TEST(CircularTest, Test3_B){
    std::cout<<"CIRCULAR DEPENDENCY TEST\n"<<std::endl;
    Infector::Container ioc;
    ioc.bindAsNothing<Kaaa>();
    ioc.bindAsNothing<Booom>();

    bool ex1=false;
    bool ex2=false;

    try{
        ioc.wire<Kaaa,Booom>();
        ioc.wire<Booom,Kaaa>();
    }catch(std::exception &ex){
        ex1 = true;
        std::cout<<ex.what()<<std::endl;
    }

    try{
        auto kaboom = ioc.build<Kaaa>();
    }
    catch(std::exception &ex){
        ex2 = true;
        std::cout<<ex.what()<<std::endl;
    }

    EXPECT_TRUE(ex1);
    EXPECT_TRUE(ex2);

    std::cout<<"\nend of test 3\n"<<std::endl;
}